

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::bin_writer<1>_>
             *this,char **it)

{
  size_t sVar1;
  iterator begin;
  char *pcVar2;
  bin_writer<1> *in_RSI;
  char **in_RDI;
  char *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  char **__n;
  
  __n = in_RDI;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 1));
  if (sVar1 != 0) {
    begin = basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 1));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 1));
    pcVar2 = copy_str<char,_const_char_*,_char_*,_0>
                       (begin,in_stack_ffffffffffffffd8,(char *)0x1508ad);
    *(char **)&in_RSI->abs_value = pcVar2;
  }
  pcVar2 = std::fill_n<char*,unsigned_long,char>(unaff_retaddr,(unsigned_long)__n,(char *)in_RSI);
  *(char **)&in_RSI->abs_value = pcVar2;
  int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>::operator()
            (in_RSI,in_RDI);
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }